

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O3

CURLcode cf_hc_connect(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  CURLcode *pCVar1;
  Curl_cfilter *pCVar2;
  void *pvVar3;
  long *plVar4;
  curl_trc_feat *pcVar5;
  CURLcode CVar6;
  timediff_t tVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  CURLcode *pCVar10;
  CURLcode CVar11;
  undefined8 uVar12;
  Curl_cfilter *pCVar13;
  cf_hc_baller *winner;
  curltime cVar14;
  curltime newer;
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  pCVar1 = (CURLcode *)cf->ctx;
  *done = false;
  cVar14 = Curl_now();
  CVar11 = CURLE_OK;
  switch(*pCVar1) {
  case CURLE_OK:
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))))
       && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"connect, init");
    }
    *(time_t *)(pCVar1 + 4) = cVar14.tv_sec;
    pCVar1[6] = cVar14.tv_usec;
    cf_hc_baller_init((cf_hc_baller *)(pCVar1 + 10),cf,data,(uint)cf->conn->transport);
    if (((((CURLE_UNSUPPORTED_PROTOCOL < (ulong)*(undefined8 *)(pCVar1 + 0x26)) &&
          (Curl_expire(data,(ulong)pCVar1[0x28],EXPIRE_ALPN_EYEBALLS), data != (Curl_easy *)0x0)) &&
         (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))))
       && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"set next attempt to start in %ums");
    }
    *pCVar1 = CURLE_UNSUPPORTED_PROTOCOL;
  case CURLE_UNSUPPORTED_PROTOCOL:
    pCVar13 = *(Curl_cfilter **)(pCVar1 + 0xc);
    CVar6 = CURLE_OK;
    if ((pCVar13 == (Curl_cfilter *)0x0) || (pCVar1[0xe] != CURLE_OK)) {
LAB_00114b91:
      pvVar3 = cf->ctx;
      if ((*(ulong *)((long)pvVar3 + 0x98) < 2) || (*(long *)((long)pvVar3 + 0x68) != 0))
      goto LAB_00114d5a;
      if (*(int *)((long)pvVar3 + 0x38) == 0) {
        newer._12_4_ = 0;
        newer.tv_sec = SUB128(cVar14._0_12_,0);
        newer.tv_usec = SUB124(cVar14._0_12_,8);
        cVar14._12_4_ = 0;
        cVar14._0_12_ = *(undefined1 (*) [12])((long)pvVar3 + 0x10);
        tVar7 = Curl_timediff(newer,cVar14);
        if ((long)(ulong)*(uint *)((long)pvVar3 + 0xa4) <= tVar7) {
          if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
              ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
               (0 < pcVar5->log_level)))) && (0 < cf->cft->log_level)) {
            Curl_trc_cf_infof(data,cf,"hard timeout of %dms reached, starting %s",
                              (ulong)*(uint *)((long)pvVar3 + 0xa4),
                              *(undefined8 *)((long)pvVar3 + 0x60));
          }
          goto LAB_00114d3b;
        }
        if ((long)(ulong)*(uint *)((long)pvVar3 + 0xa0) <= tVar7) {
          plVar4 = *(long **)((long)pvVar3 + 0x30);
          if ((plVar4 != (long *)0x0) && (*(int *)((long)pvVar3 + 0x50) < 0)) {
            (**(code **)(*plVar4 + 0x70))(plVar4,data,2,(long)pvVar3 + 0x50,0);
          }
          if (*(int *)((long)pvVar3 + 0x50) < 0) {
            if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                 (0 < pcVar5->log_level)))) && (0 < cf->cft->log_level)) {
              Curl_trc_cf_infof(data,cf,
                                "soft timeout of %dms reached, %s has not seen any data, starting %s"
                                ,(ulong)*(uint *)((long)pvVar3 + 0xa0),
                                *(undefined8 *)((long)pvVar3 + 0x28),
                                *(undefined8 *)((long)pvVar3 + 0x60));
            }
            goto LAB_00114d3b;
          }
          Curl_expire(data,(ulong)*(uint *)((long)pvVar3 + 0xa4) - tVar7,EXPIRE_ALPN_EYEBALLS);
        }
      }
      else {
        if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
            ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level)
             ))) && (0 < cf->cft->log_level)) {
          Curl_trc_cf_infof(data,cf,"all previous attempts failed, starting %s",
                            *(undefined8 *)((long)pvVar3 + 0x60));
        }
LAB_00114d3b:
        cf_hc_baller_init((cf_hc_baller *)(pCVar1 + 0x18),cf,data,(uint)cf->conn->transport);
      }
LAB_00114d5a:
      uVar8 = *(undefined8 *)(pCVar1 + 0x26);
      if (CURLE_UNSUPPORTED_PROTOCOL < (ulong)uVar8) {
        pCVar13 = *(Curl_cfilter **)(pCVar1 + 0x1a);
        if ((pCVar13 != (Curl_cfilter *)0x0) && (pCVar1[0x1c] == CURLE_OK)) {
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
             (((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
               (0 < pcVar5->log_level)) && (0 < cf->cft->log_level)))) {
            Curl_trc_cf_infof(data,cf,"connect, check %s");
            pCVar13 = *(Curl_cfilter **)(pCVar1 + 0x1a);
          }
          pCVar2 = cf->next;
          cf->next = pCVar13;
          CVar6 = Curl_conn_cf_connect(pCVar13,data,done);
          pCVar1[0x1c] = CVar6;
          *(Curl_cfilter **)(pCVar1 + 0x1a) = cf->next;
          cf->next = pCVar2;
          if ((CVar6 == CURLE_OK) && (CVar6 = CURLE_OK, *done == true)) {
            winner = (cf_hc_baller *)(pCVar1 + 0x18);
            goto LAB_00114e08;
          }
        }
        uVar8 = *(undefined8 *)(pCVar1 + 0x26);
      }
      if (uVar8 == CURLE_OK) {
        uVar9 = CURLE_OK;
      }
      else {
        uVar9 = CURLE_OK;
        uVar12 = uVar8;
        pCVar10 = pCVar1;
        do {
          pCVar10 = pCVar10 + 0xe;
          uVar9 = (uVar9 + CURLE_UNSUPPORTED_PROTOCOL) - (ulong)(*pCVar10 == CURLE_OK);
          uVar12 = uVar12 - CURLE_UNSUPPORTED_PROTOCOL;
        } while (uVar12 != CURLE_OK);
      }
      if (uVar9 == uVar8) {
        pCVar10 = pCVar1;
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
          pcVar5 = (data->state).feat;
          if (pcVar5 == (curl_trc_feat *)0x0) {
            if (cf != (Curl_cfilter *)0x0) goto LAB_00114e7d;
          }
          else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar5->log_level)) {
LAB_00114e7d:
            if (0 < cf->cft->log_level) {
              Curl_trc_cf_infof(data,cf,"connect, all attempts failed");
              uVar8 = *(undefined8 *)(pCVar1 + 0x26);
            }
          }
        }
        for (; CVar11 = CVar6, uVar8 != CURLE_OK; uVar8 = uVar8 - CURLE_UNSUPPORTED_PROTOCOL) {
          CVar11 = pCVar10[0xe];
          if (CVar11 != CURLE_OK) break;
          pCVar10 = pCVar10 + 0xe;
        }
        *pCVar1 = CURLE_URL_MALFORMAT;
        break;
      }
      *done = false;
    }
    else {
      pCVar2 = cf->next;
      cf->next = pCVar13;
      CVar6 = Curl_conn_cf_connect(pCVar13,data,done);
      pCVar1[0xe] = CVar6;
      *(Curl_cfilter **)(pCVar1 + 0xc) = cf->next;
      cf->next = pCVar2;
      if ((CVar6 != CURLE_OK) || (CVar6 = CURLE_OK, *done != true)) goto LAB_00114b91;
      winner = (cf_hc_baller *)(pCVar1 + 10);
LAB_00114e08:
      baller_connected(cf,data,winner);
    }
    CVar11 = CURLE_OK;
    break;
  case CURLE_FAILED_INIT:
    cf->field_0x24 = cf->field_0x24 | 1;
    *done = true;
    CVar11 = CURLE_OK;
    break;
  case CURLE_URL_MALFORMAT:
    CVar11 = pCVar1[8];
    cf->field_0x24 = cf->field_0x24 & 0xfe;
    *done = false;
  }
  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
    pcVar5 = (data->state).feat;
    if (pcVar5 == (curl_trc_feat *)0x0) {
      if (cf == (Curl_cfilter *)0x0) {
        return CVar11;
      }
    }
    else {
      if (cf == (Curl_cfilter *)0x0) {
        return CVar11;
      }
      if (pcVar5->log_level < 1) {
        return CVar11;
      }
    }
    if (0 < cf->cft->log_level) {
      Curl_trc_cf_infof(data,cf,"connect -> %d, done=%d",(ulong)CVar11,(ulong)*done);
    }
  }
  return CVar11;
}

Assistant:

static CURLcode cf_hc_connect(struct Curl_cfilter *cf,
                              struct Curl_easy *data,
                              bool *done)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  struct curltime now;
  CURLcode result = CURLE_OK;
  size_t i, failed_ballers;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  *done = FALSE;
  now = Curl_now();
  switch(ctx->state) {
  case CF_HC_INIT:
    DEBUGASSERT(!cf->next);
    for(i = 0; i < ctx->baller_count; i++)
      DEBUGASSERT(!ctx->ballers[i].cf);
    CURL_TRC_CF(data, cf, "connect, init");
    ctx->started = now;
    cf_hc_baller_init(&ctx->ballers[0], cf, data, cf->conn->transport);
    if(ctx->baller_count > 1) {
      Curl_expire(data, ctx->soft_eyeballs_timeout_ms, EXPIRE_ALPN_EYEBALLS);
      CURL_TRC_CF(data, cf, "set next attempt to start in %ums",
                  ctx->soft_eyeballs_timeout_ms);
    }
    ctx->state = CF_HC_CONNECT;
    FALLTHROUGH();

  case CF_HC_CONNECT:
    if(cf_hc_baller_is_active(&ctx->ballers[0])) {
      result = cf_hc_baller_connect(&ctx->ballers[0], cf, data, done);
      if(!result && *done) {
        result = baller_connected(cf, data, &ctx->ballers[0]);
        goto out;
      }
    }

    if(time_to_start_next(cf, data, 1, now)) {
      cf_hc_baller_init(&ctx->ballers[1], cf, data, cf->conn->transport);
    }

    if((ctx->baller_count > 1) && cf_hc_baller_is_active(&ctx->ballers[1])) {
      CURL_TRC_CF(data, cf, "connect, check %s", ctx->ballers[1].name);
      result = cf_hc_baller_connect(&ctx->ballers[1], cf, data, done);
      if(!result && *done) {
        result = baller_connected(cf, data, &ctx->ballers[1]);
        goto out;
      }
    }

    failed_ballers = 0;
    for(i = 0; i < ctx->baller_count; i++) {
      if(ctx->ballers[i].result)
        ++failed_ballers;
    }

    if(failed_ballers == ctx->baller_count) {
      /* all have failed. we give up */
      CURL_TRC_CF(data, cf, "connect, all attempts failed");
      for(i = 0; i < ctx->baller_count; i++) {
        if(ctx->ballers[i].result) {
          result = ctx->ballers[i].result;
          break;
        }
      }
      ctx->state = CF_HC_FAILURE;
      goto out;
    }
    result = CURLE_OK;
    *done = FALSE;
    break;

  case CF_HC_FAILURE:
    result = ctx->result;
    cf->connected = FALSE;
    *done = FALSE;
    break;

  case CF_HC_SUCCESS:
    result = CURLE_OK;
    cf->connected = TRUE;
    *done = TRUE;
    break;
  }

out:
  CURL_TRC_CF(data, cf, "connect -> %d, done=%d", result, *done);
  return result;
}